

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O2

void __thiscall Start::outputCreditsAndBetCurrentFreeGames(Start *this,double *credits,uint *bet)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"Current Credit: ");
  poVar1 = std::ostream::_M_insert<double>(*credits);
  poVar1 = std::operator<<(poVar1," Euro.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Current Bet: ");
  poVar1 = std::operator<<(poVar1,"No Bet in Free Games!");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Start::outputCreditsAndBetCurrentFreeGames(double& credits, unsigned int& bet) {
	std::cout << "Current Credit: " << credits << " Euro." << std::endl;
	std::cout << "Current Bet: " << "No Bet in Free Games!" << std::endl;
}